

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

void __thiscall IGameController::EvaluateSpawnType(IGameController *this,CSpawnEval *pEval,int Type)

{
  vec2 Pos;
  bool bVar1;
  int iVar2;
  CGameContext *this_00;
  int in_EDX;
  vector2_base<float> *in_RSI;
  vec2 in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  vector2_base<float> vVar4;
  float S;
  int c;
  int Index;
  int Result;
  int Num;
  int i;
  vec2 P;
  vec2 Positions [5];
  CCharacter *aEnts [64];
  CCollision *in_stack_fffffffffffffd38;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffffd40;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffffd44;
  vec2 *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd54;
  CCollision *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined2 in_stack_fffffffffffffd64;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  vector2_base<float> in_stack_fffffffffffffd78;
  int local_280;
  int local_27c;
  int local_278;
  int local_270;
  vector2_base<float> local_238;
  vector2_base<float> vStack_230;
  vector2_base<float> vStack_228;
  vector2_base<float> vStack_220;
  vector2_base<float> avStack_218 [2];
  undefined8 local_208 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_270 = 0;
  do {
    if (((int *)((long)in_RDI + 0x6b4))[in_EDX] <= local_270) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    GameServer((IGameController *)in_RDI);
    iVar2 = CGameWorld::FindEntities
                      ((CGameWorld *)in_RDI,in_stack_fffffffffffffd78,
                       (float)CONCAT13(in_stack_fffffffffffffd67,
                                       CONCAT12(in_stack_fffffffffffffd66,in_stack_fffffffffffffd64)
                                      ),(CEntity **)in_stack_fffffffffffffd58,
                       (int)in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
    vector2_base<float>::vector2_base(&local_238,0.0,0.0);
    vector2_base<float>::vector2_base(&vStack_230,-32.0,0.0);
    vector2_base<float>::vector2_base(&vStack_228,0.0,-32.0);
    vector2_base<float>::vector2_base(&vStack_220,32.0,0.0);
    vector2_base<float>::vector2_base(avStack_218,0.0,32.0);
    local_278 = -1;
    for (local_27c = 0; in_stack_fffffffffffffd67 = local_27c < 5 && local_278 == -1,
        local_27c < 5 && local_278 == -1; local_27c = local_27c + 1) {
      local_278 = local_27c;
      for (local_280 = 0; local_280 < iVar2; local_280 = local_280 + 1) {
        this_00 = GameServer((IGameController *)in_RDI);
        in_stack_fffffffffffffd58 = CGameContext::Collision(this_00);
        in_stack_fffffffffffffd78 =
             vector2_base<float>::operator+
                       ((vector2_base<float> *)
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        in_stack_fffffffffffffd48);
        Pos.field_1 = in_stack_fffffffffffffd44;
        Pos.field_0 = in_stack_fffffffffffffd40;
        bVar1 = CCollision::CheckPoint(in_stack_fffffffffffffd38,Pos,0);
        in_stack_fffffffffffffd66 = true;
        if (!bVar1) {
          in_stack_fffffffffffffd48 = CEntity::GetPos((CEntity *)local_208[local_280]);
          vector2_base<float>::operator+
                    ((vector2_base<float> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48);
          in_stack_fffffffffffffd54 =
               distance<float>((vector2_base<float> *)
                               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               (vector2_base<float> *)in_stack_fffffffffffffd38);
          fVar3 = CEntity::GetProximityRadius((CEntity *)local_208[local_280]);
          in_stack_fffffffffffffd66 = in_stack_fffffffffffffd54 <= fVar3;
        }
        if ((bool)in_stack_fffffffffffffd66 != false) {
          local_278 = -1;
          break;
        }
      }
    }
    if (local_278 != -1) {
      vVar4 = vector2_base<float>::operator+
                        ((vector2_base<float> *)
                         CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd48);
      if (((uint)in_RSI[1].field_0 & 0x100) == 0) {
        in_stack_fffffffffffffd44.y =
             EvaluateSpawnPos((IGameController *)
                              CONCAT17(in_stack_fffffffffffffd67,
                                       CONCAT16(in_stack_fffffffffffffd66,
                                                CONCAT24(in_stack_fffffffffffffd64,
                                                         in_stack_fffffffffffffd60))),
                              (CSpawnEval *)in_stack_fffffffffffffd58,in_RDI);
      }
      else {
        in_stack_fffffffffffffd40.x = (float)local_278;
        fVar3 = random_float();
        in_stack_fffffffffffffd44.y = in_stack_fffffffffffffd40.x + fVar3;
      }
      if ((((uint)in_RSI[1].field_0 & 1) == 0) ||
         (in_stack_fffffffffffffd44.y < in_RSI[2].field_0.x)) {
        *(undefined1 *)&in_RSI[1].field_0 = 1;
        ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)(in_RSI + 2))->y =
             (float)in_stack_fffffffffffffd44;
        *in_RSI = vVar4;
      }
    }
    local_270 = local_270 + 1;
  } while( true );
}

Assistant:

void IGameController::EvaluateSpawnType(CSpawnEval *pEval, int Type) const
{
	// get spawn point
	for(int i = 0; i < m_aNumSpawnPoints[Type]; i++)
	{
		// check if the position is occupado
		CCharacter *aEnts[MAX_CLIENTS];
		int Num = GameServer()->m_World.FindEntities(m_aaSpawnPoints[Type][i], 64, (CEntity**)aEnts, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
		vec2 Positions[5] = { vec2(0.0f, 0.0f), vec2(-32.0f, 0.0f), vec2(0.0f, -32.0f), vec2(32.0f, 0.0f), vec2(0.0f, 32.0f) };	// start, left, up, right, down
		int Result = -1;
		for(int Index = 0; Index < 5 && Result == -1; ++Index)
		{
			Result = Index;
			for(int c = 0; c < Num; ++c)
				if(GameServer()->Collision()->CheckPoint(m_aaSpawnPoints[Type][i]+Positions[Index]) ||
					distance(aEnts[c]->GetPos(), m_aaSpawnPoints[Type][i]+Positions[Index]) <= aEnts[c]->GetProximityRadius())
				{
					Result = -1;
					break;
				}
		}
		if(Result == -1)
			continue;	// try next spawn point

		vec2 P = m_aaSpawnPoints[Type][i]+Positions[Result];
		float S = pEval->m_RandomSpawn ? (Result + random_float()) : EvaluateSpawnPos(pEval, P);
		if(!pEval->m_Got || pEval->m_Score > S)
		{
			pEval->m_Got = true;
			pEval->m_Score = S;
			pEval->m_Pos = P;
		}
	}
}